

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

void leveldb_put(leveldb_t *db,leveldb_writeoptions_t *options,char *key,size_t keylen,char *val,
                size_t vallen,char **errptr)

{
  DB *pDVar1;
  Slice local_60;
  Slice local_50;
  Status local_40;
  size_t local_38;
  size_t vallen_local;
  char *val_local;
  size_t keylen_local;
  char *key_local;
  leveldb_writeoptions_t *options_local;
  leveldb_t *db_local;
  
  pDVar1 = db->rep;
  local_38 = vallen;
  vallen_local = (size_t)val;
  val_local = (char *)keylen;
  keylen_local = (size_t)key;
  key_local = (char *)options;
  options_local = (leveldb_writeoptions_t *)db;
  leveldb::Slice::Slice(&local_50,key,keylen);
  leveldb::Slice::Slice(&local_60,(char *)vallen_local,local_38);
  (*pDVar1->_vptr_DB[2])(&local_40,pDVar1,options,&local_50,&local_60);
  SaveError(errptr,&local_40);
  leveldb::Status::~Status(&local_40);
  return;
}

Assistant:

void leveldb_put(leveldb_t* db, const leveldb_writeoptions_t* options,
                 const char* key, size_t keylen, const char* val, size_t vallen,
                 char** errptr) {
  SaveError(errptr,
            db->rep->Put(options->rep, Slice(key, keylen), Slice(val, vallen)));
}